

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O0

QList<QString> * __thiscall
QMultiMap<QByteArray,_QString>::values(QMultiMap<QByteArray,_QString> *this,QByteArray *key)

{
  long lVar1;
  back_insert_iterator<QList<QString>_> __result;
  const_iterator in_RDX;
  const_iterator in_RSI;
  _Base_ptr in_RDI;
  long in_FS_OFFSET;
  pair<QMultiMap<QByteArray,_QString>::const_iterator,_QMultiMap<QByteArray,_QString>::const_iterator>
  pVar2;
  QList<QString> *result;
  pair<QMultiMap<QByteArray,_QString>::const_iterator,_QMultiMap<QByteArray,_QString>::const_iterator>
  range;
  const_iterator __last;
  const_iterator in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0;
  *(undefined8 *)in_RDI = 0xaaaaaaaaaaaaaaaa;
  in_RDI->_M_parent = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  in_RDI->_M_left = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
  __last._M_node = in_RDI;
  QList<QString>::QList((QList<QString> *)0x10588c);
  pVar2 = equal_range((QMultiMap<QByteArray,_QString> *)in_stack_ffffffffffffff98._M_node,
                      (QByteArray *)__last._M_node);
  std::distance<QMultiMap<QByteArray,QString>::const_iterator>
            ((const_iterator)in_stack_ffffffffffffff98._M_node,(const_iterator)__last._M_node);
  QList<QString>::reserve
            ((QList<QString> *)CONCAT17(uVar3,in_stack_ffffffffffffffa8),
             (qsizetype)pVar2.first.i._M_node.i);
  std::back_inserter<QList<QString>>((QList<QString> *)in_RDI);
  __result.container._7_1_ = uVar3;
  __result.container._0_7_ = in_stack_ffffffffffffffa8;
  std::copy<QMultiMap<QByteArray,QString>::const_iterator,std::back_insert_iterator<QList<QString>>>
            ((const_iterator)in_RSI._M_node,(const_iterator)in_RDX._M_node,__result);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QList<QString> *)in_RDI;
}

Assistant:

QList<T> values(const Key &key) const
    {
        QList<T> result;
        const auto range = equal_range(key);
        result.reserve(std::distance(range.first, range.second));
        std::copy(range.first, range.second, std::back_inserter(result));
        return result;
    }